

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_deserializer.cpp
# Opt level: O3

VoidConstPtr __thiscall miniros::MessageDeserializer::deserialize(MessageDeserializer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  VoidConstPtr VVar6;
  SubscriptionCallbackHelperDeserializeParams params;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0xb));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  peVar5 = (element_type *)in_RSI[0x10];
  if (peVar5 == (element_type *)0x0) {
    if (in_RSI[6] == 0) {
      if (in_RSI[4] != 0 && in_RSI[2] == 0) {
        (this->helper_).
        super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this->helper_).
        super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_001e5e54;
      }
      params.connection_header.
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      params.buffer = (uint8_t *)in_RSI[5];
      params.length = ((int)in_RSI[4] + (int)in_RSI[2]) - (int)params.buffer;
      params.connection_header.
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)in_RSI[9];
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&params.connection_header.
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 10));
      (**(code **)(*(long *)*in_RSI + 0x10))(&local_58,(long *)*in_RSI,&params);
      p_Var3 = p_Stack_50;
      uVar2 = local_58;
      local_58 = 0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x11];
      in_RSI[0x10] = uVar2;
      in_RSI[0x11] = p_Var3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
      }
      if (params.connection_header.
          super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (params.connection_header.
                   super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[3];
      in_RSI[2] = 0;
      in_RSI[3] = 0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    else {
      in_RSI[0x10] = in_RSI[6];
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x11),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 7));
    }
    peVar5 = (element_type *)in_RSI[0x10];
  }
  (this->helper_).
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x11];
  (this->helper_).
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
LAB_001e5e54:
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xb));
  VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (VoidConstPtr)VVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VoidConstPtr MessageDeserializer::deserialize()
{
  std::scoped_lock<std::mutex> lock(mutex_);

  if (msg_)
  {
    return msg_;
  }

  if (serialized_message_.message)
  {
    msg_ = serialized_message_.message;
    return msg_;
  }

  if (!serialized_message_.buf && serialized_message_.num_bytes > 0)
  {
    // If the buffer has been reset it means we tried to deserialize and failed
    return VoidConstPtr();
  }

  try
  {
    SubscriptionCallbackHelperDeserializeParams params;
    params.buffer = serialized_message_.message_start;
    params.length = serialized_message_.num_bytes - (serialized_message_.message_start - serialized_message_.buf.get());
    params.connection_header = connection_header_;
    msg_ = helper_->deserialize(params);
  }
  catch (std::exception& e)
  {
    MINIROS_ERROR("Exception thrown when deserializing message of length [%d] from [%s]: %s", (uint32_t)serialized_message_.num_bytes, (*connection_header_)["callerid"].c_str(), e.what());
  }

  serialized_message_.buf.reset();

  return msg_;
}